

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.h
# Opt level: O3

void __thiscall
yyml::nn::NN::SetLayer<yyml::nn::DenseLayer,yyml::TensorShape,yyml::TensorShape>
          (NN *this,string_view name,TensorShape *params,TensorShape *params_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  DenseLayer *new_layer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  DenseLayer *local_38;
  
  pcVar2 = name._M_str;
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar2,pcVar2 + name._M_len);
  local_38 = Factory<yyml::nn::DenseLayer>::
             GetNewInstance<yyml::TensorShape,yyml::TensorShape,std::__cxx11::string>
                       (params,params_1,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar2,pcVar2 + name._M_len);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,yyml::nn::LayerInterface*>,std::allocator<std::pair<std::__cxx11::string_const,yyml::nn::LayerInterface*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::__cxx11::string,yyml::nn::DenseLayer*&>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,yyml::nn::LayerInterface*>,std::allocator<std::pair<std::__cxx11::string_const,yyml::nn::LayerInterface*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->layers_,&local_58,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SetLayer(std::string_view name, Params... params) {
    auto* new_layer = LayerType::factory::GetNewInstance(
        std::forward<Params>(params)..., std::string(name));
    layers_.emplace(std::string(name), new_layer);
  }